

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O1

Gia_Man_t * Abc_NtkFlattenHierarchyGia(Abc_Ntk_t *pNtk,Vec_Ptr_t **pvBuffers,int fVerbose)

{
  void *pvVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Vec_Ptr_t *vBuffers;
  void **ppvVar4;
  Gia_Man_t *pGVar5;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Ptr_t *vSupers;
  Vec_Ptr_t *pVVar9;
  Gia_Man_t *p;
  char *pcVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  char *__assertion;
  
  vBuffers = (Vec_Ptr_t *)malloc(0x10);
  vBuffers->nCap = 1000;
  vBuffers->nSize = 0;
  ppvVar4 = (void **)malloc(8000);
  vBuffers->pArray = ppvVar4;
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assertion = "Abc_NtkIsNetlist(pNtk)";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
    ;
    pcVar10 = "Gia_Man_t *Abc_NtkFlattenHierarchyGia(Abc_Ntk_t *, Vec_Ptr_t **, int)";
LAB_001d42c1:
    __assert_fail(__assertion,pcVar7,0x1ab,pcVar10);
  }
  iVar12 = pNtk->vPos->nSize + pNtk->vPis->nSize;
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    iVar3 = Gia_ManFlattenLogicPrepare(pNtk);
    uVar13 = iVar3 - iVar12;
  }
  else {
    uVar13 = -iVar12;
    pVVar9 = pNtk->pDesign->vModules;
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        iVar12 = Gia_ManFlattenLogicPrepare((Abc_Ntk_t *)pVVar9->pArray[lVar11]);
        uVar13 = uVar13 + iVar12;
        lVar11 = lVar11 + 1;
        pVVar9 = pNtk->pDesign->vModules;
      } while (lVar11 < pVVar9->nSize);
    }
  }
  pGVar5 = Gia_ManStart(pNtk->vObjs->nSize);
  pcVar10 = pNtk->pName;
  if (pcVar10 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar10);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar10);
  }
  pGVar5->pName = pcVar7;
  pcVar10 = pNtk->pSpec;
  if (pcVar10 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar10);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar10);
  }
  pGVar5->pSpec = pcVar7;
  pVVar9 = pNtk->vPis;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      pvVar1 = pVVar9->pArray[lVar11];
      pGVar8 = Gia_ManAppendObj(pGVar5);
      uVar14 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar14 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar14 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pGVar5->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = pGVar5->pObjs;
      if ((pGVar8 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar8)) {
LAB_001d42ac:
        __assertion = "p->pObjs <= pObj && pObj < p->pObjs + p->nObjs";
        pcVar7 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
        ;
        pcVar10 = "int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)";
        goto LAB_001d42c1;
      }
      Vec_IntPush(pGVar5->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = pGVar5->pObjs;
      if ((pGVar8 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar8)) goto LAB_001d42ac;
      *(int *)((long)pvVar1 + 0x40) = (int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * 0x55555556;
      lVar11 = lVar11 + 1;
      pVVar9 = pNtk->vPis;
    } while (lVar11 < pVVar9->nSize);
  }
  vSupers = (Vec_Ptr_t *)malloc(0x10);
  vSupers->nCap = 100;
  vSupers->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  vSupers->pArray = ppvVar4;
  Gia_ManHashAlloc(pGVar5);
  pVVar9 = pNtk->vPos;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      Abc_NtkFlattenHierarchyGia_rec(pGVar5,vSupers,(Abc_Obj_t *)pVVar9->pArray[lVar11],vBuffers);
      lVar11 = lVar11 + 1;
      pVVar9 = pNtk->vPos;
    } while (lVar11 < pVVar9->nSize);
  }
  Gia_ManHashStop(pGVar5);
  if (vSupers->pArray != (void **)0x0) {
    free(vSupers->pArray);
    vSupers->pArray = (void **)0x0;
  }
  free(vSupers);
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (ulong)(pNtk->pDesign->vModules->nSize - 1);
  }
  printf("Hierarchy reader flattened %d instances of boxes and added %d barbufs (out of %d).\n",
         uVar14,(ulong)(uint)vBuffers->nSize,(ulong)uVar13);
  pVVar9 = pNtk->vPos;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      Gia_ManAppendCo(pGVar5,*(int *)((long)pVVar9->pArray[lVar11] + 0x40));
      lVar11 = lVar11 + 1;
      pVVar9 = pNtk->vPos;
    } while (lVar11 < pVVar9->nSize);
  }
  if (pvBuffers == (Vec_Ptr_t **)0x0) {
    if (vBuffers->pArray != (void **)0x0) {
      free(vBuffers->pArray);
      vBuffers->pArray = (void **)0x0;
    }
    free(vBuffers);
  }
  else {
    *pvBuffers = vBuffers;
  }
  p = Gia_ManCleanup(pGVar5);
  Gia_ManStop(pGVar5);
  pGVar5 = Gia_ManSweepHierarchy(p);
  Gia_ManStop(p);
  return pGVar5;
}

Assistant:

Gia_Man_t * Abc_NtkFlattenHierarchyGia( Abc_Ntk_t * pNtk, Vec_Ptr_t ** pvBuffers, int fVerbose )
{
    int fUseBufs = 1;
    Gia_Man_t * pNew, * pTemp; 
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pTerm;
    Vec_Ptr_t * vSupers;
    Vec_Ptr_t * vBuffers = fUseBufs ? Vec_PtrAlloc(1000) : NULL;
    int i, Counter = 0; 
    assert( Abc_NtkIsNetlist(pNtk) );
//    Abc_NtkPrintBoxInfo( pNtk );

    // set the PI/PO numbers
    Counter -= Abc_NtkPiNum(pNtk) + Abc_NtkPoNum(pNtk);
    if ( !pNtk->pDesign )
        Counter += Gia_ManFlattenLogicPrepare( pNtk );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            Counter += Gia_ManFlattenLogicPrepare( pModel );

    // start the manager
    pNew = Gia_ManStart( Abc_NtkObjNumMax(pNtk) );
    pNew->pName = Abc_UtilStrsav(pNtk->pName);
    pNew->pSpec = Abc_UtilStrsav(pNtk->pSpec);

    // create PIs and buffers
    Abc_NtkForEachPi( pNtk, pTerm, i )
        pTerm->iTemp = Gia_ManAppendCi( pNew );

    // call recursively
    vSupers = Vec_PtrAlloc( 100 );
    Gia_ManHashAlloc( pNew );
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pTerm, vBuffers );
    Gia_ManHashStop( pNew );
    Vec_PtrFree( vSupers );
    printf( "Hierarchy reader flattened %d instances of boxes and added %d barbufs (out of %d).\n", 
        pNtk->pDesign ? Vec_PtrSize(pNtk->pDesign->vModules)-1 : 0, Vec_PtrSize(vBuffers), Counter );

    // create buffers and POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pNew, pTerm->iTemp );

    if ( pvBuffers )
        *pvBuffers = vBuffers;
    else
        Vec_PtrFreeP( &vBuffers );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//    Gia_ManPrintStats( pNew, NULL );
    pNew = Gia_ManSweepHierarchy( pTemp = pNew );
    Gia_ManStop( pTemp );
//    Gia_ManPrintStats( pNew, NULL );
    return pNew;
}